

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  pointer __dest;
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_t *psVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uint *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  int *piVar10;
  int *piVar11;
  ulong *puVar12;
  size_t __maxlen;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  value_type vStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c0;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *pvStack_a0;
  ulong uStack_98;
  uint *puStack_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_88;
  size_t *psStack_80;
  size_t sStack_78;
  code *pcStack_70;
  string *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  size_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcStack_70 = (code *)0x16f524;
  local_68 = type;
  sVar4 = strnlen(marker,size);
  if (sVar4 != size) {
    paVar14 = &local_50.field_2;
    pcStack_70 = (code *)0x16f557;
    local_60 = data;
    local_58 = marker_size;
    local_50._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,marker,marker + sVar4);
    pcStack_70 = (code *)0x16f562;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar14) {
      pcStack_70 = (code *)0x16f56f;
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar9 = marker + sVar4 + 1;
    __maxlen = size - (sVar4 + 1);
    pcStack_70 = (code *)0x16f587;
    sVar5 = strnlen(pcVar9,__maxlen);
    if (sVar5 != __maxlen) {
      pcStack_70 = (code *)0x16f5aa;
      local_50._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar9,pcVar9 + sVar5);
      pcStack_70 = (code *)0x16f5b6;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (local_68,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar14) {
        pcStack_70 = (code *)0x16f5c3;
        operator_delete(local_50._M_dataplus._M_p);
      }
      psVar2 = local_58;
      this = local_60;
      uVar13 = __maxlen - (sVar5 + 1);
      if (3 < uVar13) {
        puVar6 = (uint *)(pcVar9 + sVar5 + 1);
        uVar8 = (ulong)*puVar6;
        if (uVar8 == 0) {
          pcStack_70 = (code *)0x16f638;
          iVar3 = std::__cxx11::string::compare((char *)local_68);
          if (iVar3 == 0) {
            *psVar2 = sVar4 + sVar5 + 6;
            pcStack_70 = (code *)0x16f665;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,1);
            *(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\0';
            return true;
          }
        }
        else if (uVar8 <= uVar13 - 4) {
          pcStack_70 = (code *)0x16f5ff;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_60,uVar8);
          __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish != __dest) {
            pcStack_70 = (code *)0x16f618;
            memcpy(__dest,pcVar9 + sVar5 + 5,uVar8);
            *psVar2 = uVar8 + sVar4 + sVar5 + 6;
            return true;
          }
          pcVar9 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          puVar12 = (ulong *)0x0;
          pcStack_70 = ReadChannelInfo;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
          psStack_80 = psVar2;
          pvStack_88 = this;
          piVar11 = (int *)*puVar12;
          pvStack_a0 = (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)pcVar9
          ;
          uStack_98 = uVar8;
          puStack_90 = puVar6;
          sStack_78 = sVar4;
          pcStack_70 = (code *)sVar5;
          if ((int *)puVar12[1] == piVar11) {
            uVar7 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f0.name._M_dataplus._M_p != &vStack_f0.name.field_2) {
              operator_delete(vStack_f0.name._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar7);
          }
          do {
            paVar14 = &bStack_c0.field_2;
            vStack_f0.name._M_dataplus._M_p = (pointer)&vStack_f0.name.field_2;
            iVar3 = *piVar11;
            if ((char)iVar3 == '\0') break;
            vStack_f0.name._M_string_length = 0;
            vStack_f0.name.field_2._M_local_buf[0] = '\0';
            uVar13 = (long)puVar12[1] - (long)piVar11;
            if ((long)uVar13 < 0) {
LAB_0016f740:
              bVar1 = false;
            }
            else {
              bStack_c0._M_dataplus._M_p = (pointer)paVar14;
              if ((int *)puVar12[1] != piVar11) {
                uVar8 = 0;
                piVar10 = piVar11;
                do {
                  if ((char)*piVar10 == '\0') {
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&bStack_c0,piVar11,piVar10);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&vStack_f0.name,&bStack_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)bStack_c0._M_dataplus._M_p != paVar14) {
                      operator_delete(bStack_c0._M_dataplus._M_p);
                    }
                    piVar11 = (int *)((long)piVar10 + 1);
                    goto LAB_0016f782;
                  }
                  piVar10 = (int *)((long)piVar10 + 1);
                  uVar8 = uVar8 + 1;
                } while (uVar8 < uVar13);
              }
              bStack_c0._M_string_length = 0;
              bStack_c0.field_2._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&vStack_f0.name,&bStack_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)bStack_c0._M_dataplus._M_p != paVar14) {
                operator_delete(bStack_c0._M_dataplus._M_p);
              }
              piVar11 = (int *)0x0;
              if (vStack_f0.name._M_string_length == 0) goto LAB_0016f740;
              piVar11 = (int *)0x0;
LAB_0016f782:
              if (piVar11 + 4 < (int *)puVar12[1]) {
                vStack_f0.pixel_type = *piVar11;
                vStack_f0.p_linear = (uchar)piVar11[1];
                vStack_f0.x_sampling = piVar11[2];
                vStack_f0.y_sampling = piVar11[3];
                bVar1 = true;
                std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::push_back
                          (pvStack_a0,&vStack_f0);
                piVar11 = piVar11 + 4;
              }
              else {
                bVar1 = false;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f0.name._M_dataplus._M_p != &vStack_f0.name.field_2) {
              operator_delete(vStack_f0.name._M_dataplus._M_p);
            }
          } while (bVar1);
          return (char)iVar3 == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}